

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::objectivec::BuildCommentsString_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,SourceLocation *location,
          bool prefer_single_line)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  protobuf *this_00;
  char *size;
  pointer pcVar3;
  void *__s1;
  pointer pbVar4;
  _Alloc_hider __s2;
  size_type __n;
  int iVar5;
  long lVar6;
  pointer pbVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  ulong uVar8;
  StringPiece full;
  string suffix;
  string prefix;
  string line;
  string epilogue;
  string local_158;
  string local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  long local_100;
  string local_f8;
  char *local_d8;
  string *local_d0;
  undefined1 local_c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  ulong local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40 [16];
  
  lVar6 = (ulong)(*(long *)(this + 0x18) == 0) * 0x20;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = *(protobuf **)(this + lVar6 + 0x10);
  size = *(char **)(this + lVar6 + 0x18);
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              ((size_t)size,"string length exceeds max size");
  }
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  local_c8._16_8_ = (pointer)0x0;
  full.length_ = (size_type)"\n";
  full.ptr_ = size;
  SplitStringAllowEmpty(this_00,full,local_c8,in_R8);
  local_98._M_allocated_capacity =
       (size_type)
       local_118.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8._8_8_ =
       local_118.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a8._M_allocated_capacity =
       (size_type)
       local_118.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._16_8_;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8._8_8_;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  local_c8._16_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8);
  pbVar7 = local_118.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length != 0) {
        local_a8._M_allocated_capacity = (size_type)&local_98;
        local_a8._8_8_ = 0;
        local_98._M_allocated_capacity = local_98._M_allocated_capacity & 0xffffffffffffff00;
        local_c8._0_8_ = local_c8 + 0x10;
        local_c8._8_8_ = (pointer)0x0;
        local_c8._16_8_ = local_c8._16_8_ & 0xffffffffffffff00;
        local_60 = &__return_storage_ptr__->field_2;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        local_50 = local_40;
        local_48 = (char *)0x0;
        local_40[0] = 0;
        local_d0 = __return_storage_ptr__;
        if ((char)location == '\x01' &&
            (long)local_118.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 == 0x20) {
          std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,0x3e55fa);
          std::__cxx11::string::_M_replace((ulong)local_c8,0,(char *)local_c8._8_8_,0x4141b3);
          local_d8 = "";
        }
        else {
          std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,0x3e55fc);
          std::__cxx11::string::_M_replace((ulong)local_c8,0,(char *)local_c8._8_8_,0x3e0fff);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x3e5604);
          local_d8 = " ";
        }
        if (local_118.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_118.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar2 = &local_f8.field_2;
          local_100 = 0;
          uVar8 = 0;
          do {
            pbVar7 = local_118.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            local_58 = uVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_158," ","");
            __s1 = *(void **)((long)&(pbVar7->_M_dataplus)._M_p + local_100);
            uVar8 = *(ulong *)((long)&pbVar7->_M_string_length + local_100);
            if ((long)uVar8 < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (uVar8,"string length exceeds max size");
            }
            __n = local_158._M_string_length;
            __s2._M_p = local_158._M_dataplus._M_p;
            if ((long)local_158._M_string_length < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (local_158._M_string_length,"string length exceeds max size");
            }
            if ((uVar8 < __n) || (iVar5 = bcmp(__s1,__s2._M_p,__n), iVar5 != 0)) {
              local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
              lVar6 = *(long *)((long)&(pbVar7->_M_dataplus)._M_p + local_100);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_80,lVar6,
                         *(long *)((long)&pbVar7->_M_string_length + local_100) + lVar6);
            }
            else {
              std::__cxx11::string::substr
                        ((ulong)&local_80,(long)&(pbVar7->_M_dataplus)._M_p + local_100);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            __return_storage_ptr__ = local_d0;
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"\\","");
            local_f8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"\\\\","");
            StringReplace(&local_158,&local_80,&local_138,&local_f8,true);
            std::__cxx11::string::operator=((string *)&local_80,(string *)&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != paVar2) {
              operator_delete(local_f8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"@","");
            local_f8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"\\@","");
            StringReplace(&local_158,&local_80,&local_138,&local_f8,true);
            std::__cxx11::string::operator=((string *)&local_80,(string *)&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != paVar2) {
              operator_delete(local_f8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"/*","");
            local_f8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/\\*","");
            StringReplace(&local_158,&local_80,&local_138,&local_f8,true);
            std::__cxx11::string::operator=((string *)&local_80,(string *)&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != paVar2) {
              operator_delete(local_f8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"*/","");
            local_f8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"*\\/","");
            StringReplace(&local_158,&local_80,&local_138,&local_f8,true);
            std::__cxx11::string::operator=((string *)&local_80,(string *)&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != paVar2) {
              operator_delete(local_f8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            std::operator+(&local_158,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_a8,&local_80);
            std::__cxx11::string::operator=((string *)&local_80,(string *)&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            StripWhitespace(&local_80);
            std::operator+(&local_158,local_d8,&local_80);
            std::__cxx11::string::operator=((string *)&local_80,(string *)&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            std::operator+(&local_158,&local_80,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c8);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_158._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            uVar8 = local_58;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p);
            }
            uVar8 = uVar8 + 1;
            local_100 = local_100 + 0x20;
          } while (uVar8 < (ulong)((long)local_118.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_118.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_allocated_capacity != &local_98) {
          operator_delete((void *)local_a8._M_allocated_capacity);
        }
        goto LAB_0026e422;
      }
      pbVar1 = local_118.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      pcVar3 = local_118.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
      pbVar4 = local_118.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar4->field_2) {
        operator_delete(pcVar3);
        pbVar7 = local_118.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    } while (pbVar7 != local_118.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0026e422:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string BuildCommentsString(const SourceLocation& location,
                           bool prefer_single_line) {
  const std::string& comments = location.leading_comments.empty()
                               ? location.trailing_comments
                               : location.leading_comments;
  std::vector<std::string> lines;
  lines = Split(comments, "\n", false);
  while (!lines.empty() && lines.back().empty()) {
    lines.pop_back();
  }
  // If there are no comments, just return an empty string.
  if (lines.empty()) {
    return "";
  }

  std::string prefix;
  std::string suffix;
  std::string final_comments;
  std::string epilogue;

  bool add_leading_space = false;

  if (prefer_single_line && lines.size() == 1) {
    prefix = "/** ";
    suffix = " */\n";
  } else {
    prefix = "* ";
    suffix = "\n";
    final_comments += "/**\n";
    epilogue = " **/\n";
    add_leading_space = true;
  }

  for (int i = 0; i < lines.size(); i++) {
    std::string line = StripPrefixString(lines[i], " ");
    // HeaderDoc and appledoc use '\' and '@' for markers; escape them.
    line = StringReplace(line, "\\", "\\\\", true);
    line = StringReplace(line, "@", "\\@", true);
    // Decouple / from * to not have inline comments inside comments.
    line = StringReplace(line, "/*", "/\\*", true);
    line = StringReplace(line, "*/", "*\\/", true);
    line = prefix + line;
    StripWhitespace(&line);
    // If not a one line, need to add the first space before *, as
    // StripWhitespace would have removed it.
    line = (add_leading_space ? " " : "") + line;
    final_comments += line + suffix;
  }
  final_comments += epilogue;
  return final_comments;
}